

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O0

bool __thiscall libchars::history::search_next(history *this)

{
  bool bVar1;
  int iVar2;
  _Self *__x;
  reference pbVar3;
  ulong uVar4;
  bool local_59;
  string *lis;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  iterator local_38;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  iterator local_28;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  history *local_18;
  history *this_local;
  
  if (((byte)this[8] & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_18 = this;
    bVar1 = std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(this + 0x30));
    local_59 = true;
    if ((!bVar1) && (local_59 = true, ((byte)this[0x50] & 1) == 0)) {
      local_28._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(this + 0x30));
      std::
      _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_List_const_iterator(&local_20,&local_28);
      local_59 = std::operator==((_Self *)(this + 0x48),&local_20);
    }
    if (local_59 == false) {
      do {
        local_38._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(this + 0x30));
        std::
        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_List_const_iterator(&local_30,&local_38);
        bVar1 = std::operator!=((_Self *)(this + 0x48),&local_30);
        if (!bVar1) {
          this[8] = (history)0x0;
          this[0x50] = (history)0x1;
          return true;
        }
        __x = std::
              _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator++((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)(this + 0x48));
        lis = (string *)
              std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(this + 0x30));
        std::
        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_List_const_iterator(&local_40,(iterator *)&lis);
        bVar1 = std::operator!=(__x,&local_40);
      } while ((!bVar1) ||
              ((pbVar3 = std::
                         _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)(this + 0x48)), *(long *)(this + 0x58) != 0 &&
               ((uVar4 = std::__cxx11::string::length(), uVar4 < *(ulong *)(this + 0x58) ||
                (iVar2 = std::__cxx11::string::compare
                                   ((ulong)(this + 0x10),0,*(string **)(this + 0x58),(ulong)pbVar3,0
                                   ), iVar2 != 0))))));
      this_local._7_1_ = true;
    }
    else {
      this[8] = (history)0x0;
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool history::search_next()
    {
        if (!busy)
            return false;

        if (lines.empty() || overflow || li == lines.end()) {
            busy = false;
            return false;
        }

        while (li != lines.end()) {
            if (++li != lines.end()) {
                const std::string& lis = *li;
                if (s_idx == 0 || (lis.length() >= s_idx && line_tmp.compare(0,s_idx,lis,0,s_idx) == 0))
                    return true;
            }
        }

        // revert back to temporary string
        busy = false;
        overflow = true;
        return true;
    }